

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O0

void __thiscall
TPZHCurlEquationFilter<double>::ChooseVertexAndEdge
          (TPZHCurlEquationFilter<double> *this,int64_t *treatVertex,int64_t *remEdge)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  reference plVar4;
  reference piVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Rb_tree_const_iterator<long> this_00;
  size_type sVar8;
  long *in_RDX;
  long *in_RSI;
  const_iterator in_RDI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar9;
  const_iterator it;
  int inode;
  iterator __end0_1;
  iterator __begin0_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  int iedge;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  long ibase;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_> *free_edges;
  iterator __end1;
  iterator __begin1;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *__range1;
  bool flag;
  int64_t ibase_free;
  int64_t base_node;
  long highest;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *in_stack_fffffffffffffec8;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffed0;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *this_01;
  value_type_conflict5 *in_stack_fffffffffffffee8;
  _Self in_stack_fffffffffffffef0;
  _Self local_108;
  _Base_ptr local_100;
  undefined1 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *in_stack_ffffffffffffff10;
  _Self local_c8;
  _Self local_c0;
  long local_b8;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b0;
  long local_a8;
  int local_9c;
  _Self local_98;
  _Self local_90;
  mapped_type *local_88;
  long local_80;
  _Self local_78;
  _Self local_70;
  set<long,_std::less<long>,_std::allocator<long>_> *local_68;
  reference local_60;
  _Self local_58;
  _Self local_50;
  _Base_ptr *local_48;
  byte local_39;
  long local_38;
  long local_30;
  long local_20;
  long *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  ::rbegin(in_stack_fffffffffffffec8);
  ppVar3 = std::
           reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
           ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                         *)in_stack_fffffffffffffed0);
  local_20 = ppVar3->first;
  local_39 = 0;
  local_48 = &in_RDI._M_node[4]._M_right;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
       ::end(in_stack_fffffffffffffec8);
  do {
    bVar2 = std::operator!=(&local_50,&local_58);
    if ((!bVar2) ||
       (local_60 = std::
                   _Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                *)0x1c21a1b), (local_39 & 1) != 0)) {
      pmVar6 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                             *)in_stack_ffffffffffffff10,
                            (key_type_conflict1 *)
                            CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      pmVar6->free_edges = pmVar6->free_edges + -1;
      pmVar6 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                             *)in_stack_ffffffffffffff10,
                            (key_type_conflict1 *)
                            CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      pmVar6->free_edges = pmVar6->free_edges + -1;
      pmVar7 = std::
               map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                             *)in_stack_ffffffffffffff10,
                            (key_type_conflict1 *)
                            CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      pmVar7->status = ERemovedEdge;
      std::
      map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
      ::operator[](in_stack_ffffffffffffff10,
                   (key_type_conflict1 *)
                   CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      std::set<long,_std::less<long>,_std::allocator<long>_>::erase
                (in_stack_fffffffffffffed0,(key_type_conflict1 *)in_stack_fffffffffffffec8);
      std::
      map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
      ::operator[](in_stack_ffffffffffffff10,
                   (key_type_conflict1 *)
                   CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      pVar9 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8);
      this_00 = pVar9.first._M_node;
      this_01 = (map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                 *)&in_RDI._M_node[4]._M_right;
      std::
      map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
      ::operator[]((map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                    *)this_00._M_node,
                   (key_type_conflict1 *)
                   CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      std::
      map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
      ::operator[]((map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                    *)this_00._M_node,
                   (key_type_conflict1 *)
                   CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      pVar9 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8);
      local_100 = (_Base_ptr)pVar9.first._M_node;
      local_108._M_node =
           (_Base_ptr)
           std::
           map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
           ::cbegin(in_stack_fffffffffffffec8);
      while( true ) {
        std::
        map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
        ::cend(in_stack_fffffffffffffec8);
        bVar2 = std::operator!=(&local_108,(_Self *)&stack0xfffffffffffffef0);
        if (!bVar2) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                      *)0x1c21e12);
        sVar8 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                          ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c21e1e);
        if (sVar8 == 0) {
          in_stack_fffffffffffffec8 =
               (map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                *)&in_RDI._M_node[4]._M_right;
          std::
          _Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                        *)in_RDI._M_node,(int)((ulong)this_01 >> 0x20));
          std::
          map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
          ::erase(this_01,in_RDI);
        }
        else {
          std::
          _Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                        *)this_01);
        }
      }
      return;
    }
    local_68 = &local_60->second;
    local_70._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffec8);
    local_78._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffec8);
    while (bVar2 = std::operator!=(&local_70,&local_78), bVar2) {
      plVar4 = std::_Rb_tree_const_iterator<long>::operator*
                         ((_Rb_tree_const_iterator<long> *)0x1c21a9b);
      local_80 = *plVar4;
      if ((local_39 & 1) != 0) break;
      local_88 = std::
                 map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                 ::operator[]((map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                               *)in_stack_ffffffffffffff10,
                              (key_type_conflict1 *)
                              CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      local_90._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
      local_98._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
      while (bVar2 = std::operator!=(&local_90,&local_98), bVar2) {
        piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x1c21b28);
        local_9c = *piVar5;
        local_a8 = (long)local_9c;
        pmVar7 = std::
                 map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                 ::operator[]((map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                               *)in_stack_ffffffffffffff10,
                              (key_type_conflict1 *)
                              CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
        if (pmVar7->status == EFreeEdge) {
          if ((local_39 & 1) != 0) break;
          local_b8 = (long)local_9c;
          pmVar7 = std::
                   map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                   ::operator[]((map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                                 *)in_stack_ffffffffffffff10,
                                (key_type_conflict1 *)
                                CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
          local_b0 = &pmVar7->vertex_connect;
          local_c0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffec8);
          local_c8._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffec8);
          while (bVar2 = std::operator!=(&local_c0,&local_c8), bVar2) {
            piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)0x1c21be9);
            iVar1 = *piVar5;
            pmVar6 = std::
                     map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                     ::operator[]((map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                                   *)in_stack_ffffffffffffff10,
                                  (key_type_conflict1 *)
                                  CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
            if (pmVar6->status != ETreatedVertex) {
              local_30 = local_80;
              *local_18 = (long)local_9c;
              *local_10 = (long)iVar1;
              local_38 = local_60->first;
              local_39 = 1;
              break;
            }
            std::_Rb_tree_const_iterator<int>::operator++
                      ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffed0);
          }
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffed0);
      }
      std::_Rb_tree_const_iterator<long>::operator++
                ((_Rb_tree_const_iterator<long> *)in_stack_fffffffffffffed0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                  *)in_stack_fffffffffffffed0);
  } while( true );
}

Assistant:

void TPZHCurlEquationFilter<TVar>::ChooseVertexAndEdge(int64_t &treatVertex, int64_t &remEdge)
{
    
    // The treated node must be connected to an already treated node by a free edge
    // Thus, we take a treated node and then a free edge and its 
    // corresponding second node to be the treated one
    auto highest = freeEdgesToTreatedNodes.rbegin()->first; // highest number of free edges
    int64_t base_node;
    int64_t ibase_free;
    bool flag = false;
    // We look at all the treated nodes, starting from the one with the highest number of free edges
    for (const auto& free_edges : freeEdgesToTreatedNodes){
        if (flag) break;
        // We loop over each treated vertex with the maximum value of free edges (called basis node) 
        for (auto ibase : free_edges.second){       
            if (flag) break;
            // We loop over each edge connected to the basis node
            for (auto iedge : mVertex[ibase].edge_connect){
                if (mEdge[iedge].status != EFreeEdge) continue; // only free edges can be removed
                if (flag) break;
                // For each edge connected to the basis node, check if the complementary 
                // node has been treated before (to avoid choosing the same treatedNode more than once)
                for (auto inode : mEdge[iedge].vertex_connect){
                    if (mVertex[inode].status == ETreatedVertex) {
                        //The complementary node has been tretated, go to the next one
                        continue;
                    }
                    // The node was not treated before, then it is the chosen one.
                    // Thus fill the variables with the proper values
                    base_node = ibase;
                    remEdge = iedge;
                    treatVertex = inode;
                    ibase_free = free_edges.first;
                    
                    flag = true;
                    break;
                }
            }
        }
    }

    mVertex[base_node].free_edges--;
    mVertex[treatVertex].free_edges--;
    mEdge[remEdge].status = ERemovedEdge;
    
    //Update the data structure.
    //Delete node and realocate the base node
    freeEdgesToTreatedNodes[ibase_free].erase(base_node);
    freeEdgesToTreatedNodes[ibase_free-1].insert(base_node);
    //Insert treatVertex
    freeEdgesToTreatedNodes[mVertex[treatVertex].free_edges].insert(treatVertex);

    //Clears the freeEdgesToTreatedNodes with 0 nodes in some free edges - to avoid a bug when looping std::map
    for (auto it = freeEdgesToTreatedNodes.cbegin(); it != freeEdgesToTreatedNodes.cend();) {
        if (it->second.size() == 0) {
            freeEdgesToTreatedNodes.erase(it++);
        } else {
            ++it;
        }
    }//it
}